

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_console.cpp
# Opt level: O0

void crnlib::console::add_console_output_func(console_output_func pFunc,void *pData)

{
  void *in_RSI;
  EVP_PKEY_CTX *in_RDI;
  scoped_mutex lock;
  console_func *in_stack_ffffffffffffffc8;
  vector<crnlib::console::console_func> *in_stack_ffffffffffffffd0;
  console_func local_28;
  void *local_10;
  EVP_PKEY_CTX *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  init(in_RDI);
  scoped_mutex::scoped_mutex
            ((scoped_mutex *)in_stack_ffffffffffffffd0,(mutex *)in_stack_ffffffffffffffc8);
  console_func::console_func(&local_28,(console_output_func)local_8,local_10);
  vector<crnlib::console::console_func>::push_back
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  scoped_mutex::~scoped_mutex((scoped_mutex *)0x11b55a);
  return;
}

Assistant:

void console::add_console_output_func(console_output_func pFunc, void* pData) {
  init();

  scoped_mutex lock(*m_pMutex);

  m_output_funcs.push_back(console_func(pFunc, pData));
}